

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator<QHashPrivate::Node<QString,_QHashDummyValue>_> __thiscall
QHashPrivate::iterator<QHashPrivate::Node<QString,_QHashDummyValue>_>::operator++
          (iterator<QHashPrivate::Node<QString,_QHashDummyValue>_> *this)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = this->bucket;
  uVar1 = this->d->numBuckets;
  do {
    uVar2 = uVar2 + 1;
    this->bucket = uVar2;
    if (uVar1 == uVar2) {
      this->d = (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0;
      this->bucket = 0;
      break;
    }
  } while (this->d->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
  return *this;
}

Assistant:

iterator operator++() noexcept
    {
        while (true) {
            ++bucket;
            if (bucket == d->numBuckets) {
                d = nullptr;
                bucket = 0;
                break;
            }
            if (!isUnused())
                break;
        }
        return *this;
    }